

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

FIOBJ http_req2str(http_s *h)

{
  char *dest;
  size_t sVar1;
  FIOBJ obj;
  undefined1 local_48 [8];
  fio_str_info_s t;
  header_writer_s w;
  http_s *h_local;
  
  if (((h == (http_s *)0x0) || (((h->method == 0 && (h->status_str == 0)) && (h->status != 0)))) ||
     (sVar1 = fiobj_hash_count(h->headers), sVar1 == 0)) {
    h_local = (http_s *)0x0;
  }
  else {
    t.data = (char *)fiobj_str_buf(0);
    if (h->status_str == 0) {
      fiobj_str_concat((FIOBJ)t.data,h->method);
      fiobj_str_write((FIOBJ)t.data," ",1);
      fiobj_str_concat((FIOBJ)t.data,h->path);
      if (h->query != 0) {
        fiobj_str_write((FIOBJ)t.data,"?",1);
        fiobj_str_concat((FIOBJ)t.data,h->query);
      }
      fiobj_obj2cstr((fio_str_info_s *)local_48,h->version);
      if ((t.capa < 6) || (*(char *)(t.len + 5) != '1')) {
        fiobj_str_write((FIOBJ)t.data," HTTP/1.1\r\n",10);
      }
      else {
        fiobj_str_write((FIOBJ)t.data," ",1);
        fiobj_str_concat((FIOBJ)t.data,h->version);
        fiobj_str_write((FIOBJ)t.data,"\r\n",2);
      }
    }
    else {
      fiobj_str_concat((FIOBJ)t.data,h->version);
      fiobj_str_write((FIOBJ)t.data," ",1);
      dest = t.data;
      obj = fiobj_num_tmp(h->status);
      fiobj_str_concat((FIOBJ)dest,obj);
      fiobj_str_write((FIOBJ)t.data," ",1);
      fiobj_str_concat((FIOBJ)t.data,h->status_str);
      fiobj_str_write((FIOBJ)t.data,"\r\n",2);
    }
    fiobj_each1(h->headers,0,write_header,&t.data);
    fiobj_str_write((FIOBJ)t.data,"\r\n",2);
    if (h->body != 0) {
      fiobj_str_concat((FIOBJ)t.data,h->body);
    }
    h_local = (http_s *)t.data;
  }
  return (FIOBJ)h_local;
}

Assistant:

FIOBJ http_req2str(http_s *h) {
  if (HTTP_INVALID_HANDLE(h) || !fiobj_hash_count(h->headers))
    return FIOBJ_INVALID;

  struct header_writer_s w;
  w.dest = fiobj_str_buf(0);
  if (h->status_str) {
    fiobj_str_join(w.dest, h->version);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, fiobj_num_tmp(h->status));
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->status_str);
    fiobj_str_write(w.dest, "\r\n", 2);
  } else {
    fiobj_str_join(w.dest, h->method);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    {
      fio_str_info_s t = fiobj_obj2cstr(h->version);
      if (t.len < 6 || t.data[5] != '1')
        fiobj_str_write(w.dest, " HTTP/1.1\r\n", 10);
      else {
        fiobj_str_write(w.dest, " ", 1);
        fiobj_str_join(w.dest, h->version);
        fiobj_str_write(w.dest, "\r\n", 2);
      }
    }
  }

  fiobj_each1(h->headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  if (h->body) {
    // fiobj_data_seek(h->body, 0);
    // fio_str_info_s t = fiobj_data_read(h->body, 0);
    // fiobj_str_write(w.dest, t.data, t.len);
    fiobj_str_join(w.dest, h->body);
  }
  return w.dest;
}